

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::parse(CmdLine *this)

{
  char cVar1;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __first;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference pbVar5;
  ulong uVar6;
  char *pcVar7;
  reference ppAVar8;
  reference ppCVar9;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __last;
  undefined8 uVar10;
  long in_RDI;
  Command *cmd;
  BaseException *anon_var_0;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  it;
  Arguments *args;
  Command **prev;
  iterator __end8;
  iterator __begin8;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> *__range8;
  bool stopProcessing;
  anon_class_24_3_c2b40766 check;
  ArgIface *tmp;
  ArgIface *a;
  iterator __end5;
  iterator __begin5;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *__range5;
  ArgIface *arg_1;
  String flag;
  size_type length;
  size_type i;
  bool failed;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> tmpArgs;
  ArgIface *arg;
  String value;
  bool valuePrepended;
  bool splitted;
  size_type eqIt;
  String word;
  Context *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  allocator *paVar11;
  Command *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  byte in_stack_fffffffffffffbf7;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc08;
  Command *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  String *in_stack_fffffffffffffc30;
  CmdLine *in_stack_fffffffffffffc38;
  CmdLine *in_stack_fffffffffffffc40;
  Command *in_stack_fffffffffffffc78;
  CmdLine *in_stack_fffffffffffffc80;
  undefined1 local_370 [39];
  allocator local_349;
  string local_348 [56];
  CmdLine *in_stack_fffffffffffffcf0;
  anon_class_24_3_c2b40766 *in_stack_fffffffffffffd00;
  const_iterator in_stack_fffffffffffffd58;
  CmdLine *in_stack_fffffffffffffd60;
  __normal_iterator<Args::Command_**,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
  local_268;
  long local_260;
  byte local_251;
  undefined1 *local_248;
  string *local_240;
  undefined1 local_238 [48];
  string local_208 [96];
  int local_1a8;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [96];
  CmdLine *local_140;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  ulong local_c8;
  ulong local_c0;
  byte local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [24];
  ArgIface *local_98;
  string local_90 [48];
  string local_60 [38];
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  string local_28 [40];
  
  clear((CmdLine *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  checkCorrectnessBeforeParsing(in_stack_fffffffffffffcf0);
  do {
    bVar2 = Context::atEnd((Context *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0))
    ;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      checkCorrectnessAfterParsing(in_stack_fffffffffffffc40);
      return;
    }
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Context::next_abi_cxx11_(in_stack_fffffffffffffbd8);
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    std::__cxx11::string::string(local_28,(string *)pbVar5);
    local_38 = std::__cxx11::string::find((char)local_28,0x3d);
    local_39 = 0;
    local_3a = 0;
    if (local_38 != -1) {
      local_39 = 1;
      std::__cxx11::string::substr((ulong)local_60,(ulong)local_28);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_3a = 1;
        Context::prepend((Context *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         (String *)in_stack_fffffffffffffbe8);
      }
      std::__cxx11::string::substr((ulong)local_90,(ulong)local_28);
      std::__cxx11::string::operator=(local_28,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_60);
    }
    bVar2 = details::isArgument((String *)0x107995);
    if (bVar2) {
      local_98 = findArgument(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      if (local_98 == (ArgIface *)0x0) {
        if ((*(uint *)(in_RDI + 0x78) & 2) == 0) {
          printInfoAboutUnknownArgument
                    (in_stack_fffffffffffffd60,(String *)in_stack_fffffffffffffd58._M_current);
        }
        else {
          savePositionalArguments
                    (in_stack_fffffffffffffc80,(String *)in_stack_fffffffffffffc78,
                     SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
        }
      }
      else {
        (*local_98->_vptr_ArgIface[0xf])(local_98,in_RDI + 0x18);
      }
LAB_00108870:
      local_1a8 = 0;
    }
    else {
      bVar2 = details::isFlag((String *)in_stack_fffffffffffffbd8);
      if (bVar2) {
        std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::vector
                  ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x107a7e);
        local_b1 = 0;
        local_c0 = 1;
        local_c8 = std::__cxx11::string::length();
        for (; local_c0 < local_c8; local_c0 = local_c0 + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"-",&local_109);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
          cVar1 = *pcVar7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,1,cVar1,&local_131);
          std::operator+(in_stack_fffffffffffffc18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc10);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
          in_stack_fffffffffffffc40 =
               (CmdLine *)findArgument(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          local_140 = in_stack_fffffffffffffc40;
          if (in_stack_fffffffffffffc40 == (CmdLine *)0x0) {
            local_b1 = 1;
            if ((*(uint *)(in_RDI + 0x78) & 2) == 0) {
              local_1a2 = 1;
              uVar10 = __cxa_allocate_exception(0x30);
              paVar11 = &local_1a1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1a0,"Unknown argument \"",paVar11);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0);
              BaseException::BaseException
                        ((BaseException *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         (String *)in_stack_fffffffffffffbe8);
              local_1a2 = 0;
              __cxa_throw(uVar10,&BaseException::typeinfo,BaseException::~BaseException);
            }
            local_1a8 = 4;
          }
          else {
            std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::push_back
                      ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (value_type *)in_stack_fffffffffffffbe8);
            if ((local_c0 < local_c8 - 1) &&
               (uVar3 = (*(local_140->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API[4])
                                  (), (uVar3 & 1) != 0)) {
              local_b1 = 1;
              if ((*(uint *)(in_RDI + 0x78) & 2) == 0) {
                local_238[0x2e] = 1;
                uVar10 = __cxa_allocate_exception(0x30);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_208,
                           "Only last argument in flags combo can be with value. Flags combo is \"",
                           (allocator *)(local_238 + 0x2f));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0);
                BaseException::BaseException
                          ((BaseException *)
                           CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                           (String *)in_stack_fffffffffffffbe8);
                local_238[0x2e] = 0;
                __cxa_throw(uVar10,&BaseException::typeinfo,BaseException::~BaseException);
              }
              local_1a8 = 4;
            }
            else {
              (*(local_140->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API[0xf])
                        (local_140,in_RDI + 0x18);
              local_1a8 = 0;
            }
          }
          std::__cxx11::string::~string(local_e8);
          if (local_1a8 != 0) break;
        }
        if (((local_b1 & 1) != 0) && ((*(uint *)(in_RDI + 0x78) & 2) != 0)) {
          local_238._32_8_ = local_b0;
          local_238._24_8_ =
               std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::begin
                         ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                          in_stack_fffffffffffffbd8);
          local_238._16_8_ =
               std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::end
                         ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                          in_stack_fffffffffffffbd8);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                                     *)in_stack_fffffffffffffbe0,
                                    (__normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                                     *)in_stack_fffffffffffffbd8), bVar2) {
            ppAVar8 = __gnu_cxx::
                      __normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                      ::operator*((__normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                                   *)(local_238 + 0x18));
            local_238._8_8_ = *ppAVar8;
            (*(((CmdLine *)local_238._8_8_)->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>).
              _vptr_API[0xd])();
            __gnu_cxx::
            __normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
            ::operator++((__normal_iterator<Args::ArgIface_**,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                          *)(local_238 + 0x18));
          }
          savePositionalArguments
                    (in_stack_fffffffffffffc80,(String *)in_stack_fffffffffffffc78,
                     SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
        }
        std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~vector
                  ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                   CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
        goto LAB_00108870;
      }
      in_stack_fffffffffffffc10 =
           (Command *)findArgument(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      local_248 = local_238;
      local_240 = local_28;
      local_238._0_8_ = in_stack_fffffffffffffc10;
      if (in_stack_fffffffffffffc10 == (Command *)0x0) {
        if ((*(uint *)(in_RDI + 0x78) & 2) == 0) {
          printInfoAboutUnknownArgument
                    (in_stack_fffffffffffffd60,(String *)in_stack_fffffffffffffd58._M_current);
        }
        else {
          savePositionalArguments
                    (in_stack_fffffffffffffc80,(String *)in_stack_fffffffffffffc78,
                     SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
        }
        goto LAB_00108870;
      }
      iVar4 = (*(in_stack_fffffffffffffc10->super_GroupIface).super_ArgIface._vptr_ArgIface[2])();
      if (iVar4 != 0) {
        if ((*(uint *)(in_RDI + 0x78) & 2) == 0) {
          printInfoAboutUnknownArgument
                    (in_stack_fffffffffffffd60,(String *)in_stack_fffffffffffffd58._M_current);
        }
        else {
          savePositionalArguments
                    (in_stack_fffffffffffffc80,(String *)in_stack_fffffffffffffc78,
                     SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
        }
        goto LAB_00108870;
      }
      local_251 = 0;
      bVar2 = std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::empty
                        ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      if (bVar2) {
        parse::anon_class_24_3_c2b40766::operator()(in_stack_fffffffffffffd00);
      }
      else {
        local_260 = in_RDI + 0x60;
        local_268._M_current =
             (Command **)
             std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::begin
                       ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                        in_stack_fffffffffffffbd8);
        std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::end
                  ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                   in_stack_fffffffffffffbd8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<Args::Command_**,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                                   *)in_stack_fffffffffffffbe0,
                                  (__normal_iterator<Args::Command_**,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                                   *)in_stack_fffffffffffffbd8), bVar2) {
          ppCVar9 = __gnu_cxx::
                    __normal_iterator<Args::Command_**,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                    ::operator*(&local_268);
          __last._M_current =
               (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
               GroupIface::children(&(*ppCVar9)->super_GroupIface);
          std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::cbegin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                    *)in_stack_fffffffffffffbd8);
          std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                  *)in_stack_fffffffffffffbd8);
          in_stack_fffffffffffffd60 = (CmdLine *)local_238;
          __first._M_current._4_4_ = iVar4;
          __first._M_current._0_4_ = in_stack_fffffffffffffc08;
          in_stack_fffffffffffffbf8 =
               std::
               find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::parse()::_lambda(auto:1_const&)_1_>
                         (__first,__last,
                          (anon_class_8_1_ba1d7c77_for__M_pred)in_stack_fffffffffffffbf8._M_current)
          ;
          in_stack_fffffffffffffd58 =
               std::
               vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
               ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                       *)in_stack_fffffffffffffbd8);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                              *)in_stack_fffffffffffffbe0,
                             (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                              *)in_stack_fffffffffffffbd8);
          in_stack_fffffffffffffbf7 = 0;
          if (bVar2) {
            in_stack_fffffffffffffbe8 =
                 (Command *)Command::findChild(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
            in_stack_fffffffffffffbf7 = in_stack_fffffffffffffbe8 != (Command *)0x0 ^ 0xff;
          }
          if ((in_stack_fffffffffffffbf7 & 1) != 0) {
            uVar10 = __cxa_allocate_exception(0x30);
            paVar11 = &local_349;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_348,
                       "Only one command from one level can be specified. But you defined \"",
                       paVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffbe8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           paVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffbe8,(char *)paVar11);
            (*((*ppCVar9)->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(local_370);
            std::operator+(in_stack_fffffffffffffc18,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffbe8,(char *)paVar11);
            BaseException::BaseException
                      ((BaseException *)
                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (String *)in_stack_fffffffffffffbe8);
            __cxa_throw(uVar10,&BaseException::typeinfo,BaseException::~BaseException);
          }
          __gnu_cxx::
          __normal_iterator<Args::Command_**,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
          ::operator++(&local_268);
        }
        parse::anon_class_24_3_c2b40766::operator()(in_stack_fffffffffffffd00);
      }
      if ((local_251 & 1) == 0) {
        if (*(long *)(in_RDI + 0x50) == 0) {
          *(undefined8 *)(in_RDI + 0x50) = local_238._0_8_;
          *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x50);
          std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back
                    ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                     CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     (value_type *)in_stack_fffffffffffffbe8);
          (**(code **)(**(long **)(in_RDI + 0x50) + 0x78))(*(long **)(in_RDI + 0x50),in_RDI + 0x18);
        }
        else {
          in_stack_fffffffffffffc78 = (Command *)local_238._0_8_;
          Command::setCurrentSubCommand(*(Command **)(in_RDI + 0x58),(Command *)local_238._0_8_);
          *(Command **)(in_RDI + 0x58) = in_stack_fffffffffffffc78;
          std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back
                    ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                     CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     (value_type *)in_stack_fffffffffffffbe8);
          (**(code **)(**(long **)(in_RDI + 0x58) + 0x78))(*(long **)(in_RDI + 0x58),in_RDI + 0x18);
        }
        goto LAB_00108870;
      }
      local_1a8 = 2;
    }
    std::__cxx11::string::~string(local_28);
  } while( true );
}

Assistant:

inline void
CmdLine::parse()
{
	clear();

	checkCorrectnessBeforeParsing();

	while( !m_context.atEnd() )
	{
		String word = *m_context.next();

		const String::size_type eqIt = word.find( '=' );

		bool splitted = false;
		bool valuePrepended = false;

		if( eqIt != String::npos )
		{
			splitted = true;

			const String value = word.substr( eqIt + 1 );

			if( !value.empty() )
			{
				valuePrepended = true;
				m_context.prepend( value );
			}

			word = word.substr( 0, eqIt );
		}

		if( details::isArgument( word ) )
		{
			auto * arg = findArgument( word );

			if( arg )
				arg->process( m_context );
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
		else if( details::isFlag( word ) )
		{
			std::vector< ArgIface* > tmpArgs;
			bool failed = false;

			for( String::size_type i = 1, length = word.length(); i < length; ++i )
			{
				const String flag = String( SL( "-" ) ) +

#ifdef ARGS_QSTRING_BUILD
					String( word[ i ] );
#else
					String( 1, word[ i ] );
#endif

				auto * arg = findArgument( flag );

				if( !arg )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Unknown argument \"" ) ) +
							flag + SL( "\"." ) );
					else
						break;
				}
				else
					tmpArgs.push_back( arg );

				if( i < length - 1 && arg->isWithValue() )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Only last argument in "
							"flags combo can be with value. Flags combo is \"" ) ) +
							word + SL( "\"." ) );
					else
						break;
				}
				else
					arg->process( m_context );
			}

			if( failed && ( m_opt & HandlePositionalArguments ) )
			{
				for( auto * a : tmpArgs )
					a->clear();

				savePositionalArguments( word, splitted, valuePrepended );
			}
		}
		// Command?
		else
		{
			auto * tmp = findArgument( word );

			auto check = [this, &tmp, &word] ()
			{
				const auto & args = m_args;

				const auto it = std::find_if( args.cbegin(),
					args.cend(), [&tmp] ( const auto & arg ) -> bool
						{ return ( arg.get() == tmp ); } );

				if( m_command && it != args.cend() && !m_command->findChild( word ) )
					throw BaseException( String( SL(
							"Only one command from one level can be specified. "
							"But you defined \"" ) ) +
						word + SL( "\" and \"" ) + m_command->name() + SL( "\"." ) );
			};

			if( tmp )
			{
				if( tmp->type() == ArgType::Command )
				{
					bool stopProcessing = false;

					try {
						if( !m_prevCommand.empty() )
						{
							for( const auto & prev : m_prevCommand )
							{
								const auto & args = prev->children();

								const auto it = std::find_if( args.cbegin(),
									args.cend(), [&tmp] ( const auto & arg ) -> bool
										{ return ( arg.get() == tmp ); } );

								if( it != args.cend() && !m_currCommand->findChild( word ) )
									throw BaseException( String( SL(
											"Only one command from one level can be specified. "
											"But you defined \"" ) ) +
										word + SL( "\" and \"" ) + prev->name() + SL( "\"." ) );
							}

							check();
						}
						else
							check();
					}
					catch( const BaseException & )
					{
						if( m_opt & HandlePositionalArguments )
						{
							savePositionalArguments( word, splitted, valuePrepended );

							stopProcessing = true;
						}
						else
							throw;
					}

					if( stopProcessing )
						continue;

					if( !m_command )
					{
						m_command = static_cast< Command* > ( tmp );

						m_currCommand = m_command;

						m_prevCommand.push_back( m_command );

						m_command->process( m_context );
					}
					else
					{
						auto * cmd = static_cast< Command* > ( tmp );

						m_currCommand->setCurrentSubCommand( cmd );

						m_currCommand = cmd;

						m_prevCommand.push_back( m_currCommand );

						m_currCommand->process( m_context );
					}
				}
				else if( m_opt & HandlePositionalArguments )
					savePositionalArguments( word, splitted, valuePrepended );
				else
					printInfoAboutUnknownArgument( word );
			}
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
	}

	checkCorrectnessAfterParsing();
}